

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_Guard_Test::TestBody(Arena_Guard_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  internal iVar3;
  size_t needed;
  char *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *in_R9;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr;
  Guard g2;
  Guard g4;
  Guard noop;
  Guard g1;
  Arena arena;
  Guard g5;
  Guard emptyGuard;
  Guard emptyGuard2;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  Arena local_b0;
  Guard local_90;
  Message local_80;
  Guard local_78;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  Guard local_58;
  AssertHelper local_48;
  Guard local_40;
  
  memt::Arena::Arena(&local_b0);
  local_e0._8_8_ = local_b0._blocks._block._position;
  if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
    if (local_b0._blocks._block._previous == (Block *)0x0) {
      local_e0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_e0._8_8_ = (local_b0._blocks._block._previous)->_position;
    }
  }
  local_e0._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  memt::Arena::Guard::~Guard((Guard *)local_e0);
  if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
    if (local_b0._blocks._block._previous == (Block *)0x0) {
      local_e0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_58.mPosition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_e0._8_8_ = (local_b0._blocks._block._previous)->_position;
      local_58.mPosition = (local_b0._blocks._block._previous)->_position;
    }
  }
  else {
    local_e0._8_8_ = local_b0._blocks._block._position;
    local_58.mPosition = local_b0._blocks._block._position;
  }
  local_e0._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  local_58.mArena = &local_b0;
  memt::Arena::Guard::~Guard(&local_58);
  memt::Arena::Guard::~Guard((Guard *)local_e0);
  local_58.mPosition = local_b0._blocks._block._position;
  if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
    if (local_b0._blocks._block._previous == (Block *)0x0) {
      local_58.mPosition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_58.mPosition = (local_b0._blocks._block._previous)->_position;
    }
  }
  local_58.mArena = &local_b0;
  if ((ulong)((long)local_b0._blocks._block._end - (long)local_b0._blocks._block._position) < 10000)
  {
    memt::Arena::growCapacity(&local_b0,10000);
  }
  if (&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_b0._blocks._block._position + 0x2700))->field_2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._blocks._block._begin) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_b0._blocks._block._position;
    local_b0._blocks._block._position =
         (char *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)local_b0._blocks._block._position + 0x2700))->field_2;
    memt::Arena::freeTopFromOldBlock(&local_b0,pbVar4);
  }
  local_40.mPosition = local_b0._blocks._block._position;
  if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
    if (local_b0._blocks._block._previous == (Block *)0x0) {
      local_40.mPosition = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_40.mPosition = (local_b0._blocks._block._previous)->_position;
    }
  }
  lVar5 = 6;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.mArena = &local_b0;
  do {
    if (lVar5 == 3) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_b0._blocks._block._position;
      if (local_b0._blocks._block._end == local_b0._blocks._block._position) {
        memt::Arena::growCapacity(&local_b0,1);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
      }
      local_b0._blocks._block._position = (char *)&pbVar4->_M_string_length;
    }
    local_e0._8_8_ = local_b0._blocks._block._position;
    if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
      if (local_b0._blocks._block._previous == (Block *)0x0) {
        local_e0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_e0._8_8_ = (local_b0._blocks._block._previous)->_position;
      }
    }
    local_e0._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
    memt::Arena::Guard::~Guard((Guard *)local_e0);
    if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
      if (local_b0._blocks._block._previous == (Block *)0x0) {
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0._blocks._block._previous)->_position;
        local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0._blocks._block._previous)->_position;
      }
    }
    else {
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
    }
    ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_b0._blocks._block._position;
    local_100 = (undefined1  [8])&local_b0;
    local_c0 = (undefined1  [8])&local_b0;
    if (local_b0._blocks._block._end == local_b0._blocks._block._position) {
      memt::Arena::growCapacity(&local_b0,1);
      ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._blocks._block._position;
    }
    local_b0._blocks._block._position = (char *)&ptr->_M_string_length;
    bVar2 = memt::Arena::fromArena(&local_b0,ptr);
    local_f0[0] = bVar2;
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_f0,(AssertionResult *)"arena.fromArena(tmp)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xfe,(char *)local_e0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if ((MemoryBlocks *)local_e0._0_8_ != (MemoryBlocks *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.mArena
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_90.mArena + 8))();
      }
      if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8,local_e8);
      }
      memt::Arena::Guard::~Guard((Guard *)local_100);
LAB_00110889:
      memt::Arena::Guard::~Guard((Guard *)local_c0);
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_b0._blocks._block._position;
      goto LAB_00110a51;
    }
    local_100 = (undefined1  [8])0x0;
    memt::Arena::Guard::~Guard((Guard *)local_100);
    bVar2 = memt::Arena::fromArena(&local_b0,ptr);
    local_100[0] = bVar2;
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_100,(AssertionResult *)"arena.fromArena(tmp)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x101,(char *)local_e0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if ((MemoryBlocks *)local_e0._0_8_ != (MemoryBlocks *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      if (local_f0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_f0 + 8))();
      }
      if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,local_f8);
      }
      goto LAB_00110889;
    }
    if (local_b0._blocks._block._position == local_b0._blocks._block._begin) {
      if (local_b0._blocks._block._previous == (Block *)0x0) {
        local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_90.mPosition =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78.mPosition =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0._blocks._block._previous)->_position;
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b0._blocks._block._previous)->_position;
        local_90.mPosition = (local_b0._blocks._block._previous)->_position;
        local_78.mPosition = (local_b0._blocks._block._previous)->_position;
      }
    }
    else {
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
      local_90.mPosition = local_b0._blocks._block._position;
      local_78.mPosition = local_b0._blocks._block._position;
    }
    local_78.mArena = (Arena *)0x0;
    local_100 = (undefined1  [8])0x0;
    local_f0 = (undefined1  [8])&local_b0;
    local_90.mArena = &local_b0;
    iVar3 = (internal)memt::Arena::fromArena(&local_b0,ptr);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68[0] = iVar3;
    if (!(bool)iVar3) {
      testing::Message::Message(&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,local_68,(AssertionResult *)"arena.fromArena(tmp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x108,(char *)local_e0._0_8_);
      testing::internal::AssertHelper::operator=(&local_48,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((MemoryBlocks *)local_e0._0_8_ != (MemoryBlocks *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      if (local_80.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_80.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
    }
    memt::Arena::Guard::~Guard(&local_78);
    memt::Arena::Guard::~Guard(&local_90);
    memt::Arena::Guard::~Guard((Guard *)local_f0);
    memt::Arena::Guard::~Guard((Guard *)local_100);
    memt::Arena::Guard::~Guard((Guard *)local_c0);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_b0._blocks._block._position;
    if (!(bool)iVar3) goto LAB_00110a51;
    bVar2 = memt::Arena::fromArena(&local_b0,ptr);
    local_c0[0] = !bVar2;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      testing::Message::Message((Message *)local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_c0,(AssertionResult *)"arena.fromArena(tmp)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x10a,(char *)local_e0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
      if ((MemoryBlocks *)local_e0._0_8_ != (MemoryBlocks *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_100 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
      goto joined_r0x00110933;
    }
    needed = memt::MemoryBlocks::getMemoryUse((MemoryBlocks *)&local_b0);
    if (((ulong)((long)local_b0._blocks._block._end - (long)local_b0._blocks._block._position) <=
         needed - 1) &&
       ((needed != 0 ||
        (needed = 1, local_b0._blocks._block._end == local_b0._blocks._block._position)))) {
      memt::Arena::growCapacity(&local_b0,needed);
    }
    local_b0._blocks._block._position =
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_b0._blocks._block._position)->_M_dataplus)->_M_local_buf +
         (needed + 7 & 0xfffffffffffffff8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  local_c0[0] = pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    testing::Message::Message((Message *)local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e0,(internal *)local_c0,(AssertionResult *)"fromIteration3 != 0",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x110,(char *)local_e0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_100);
  }
  else {
    bVar2 = memt::Arena::fromArena(&local_b0,pbVar4);
    local_c0[0] = bVar2;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      pbVar1 = pbVar4;
      if ((ulong)((long)local_b0._blocks._block._end - (long)local_b0._blocks._block._begin) <=
          (ulong)((long)pbVar4 - (long)local_b0._blocks._block._begin)) {
        memt::Arena::freeAndAllAfterFromOldBlock(&local_b0,pbVar4);
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_b0._blocks._block._position;
      }
      goto LAB_00110a51;
    }
    testing::Message::Message((Message *)local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e0,(internal *)local_c0,
               (AssertionResult *)"arena.fromArena(fromIteration3)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x111,(char *)local_e0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_100);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
  if ((MemoryBlocks *)local_e0._0_8_ != (MemoryBlocks *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if (local_100 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_100 + 8))();
  }
joined_r0x00110933:
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_b0._blocks._block._position;
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_b0._blocks._block._position;
  }
LAB_00110a51:
  local_b0._blocks._block._position = (char *)pbVar1;
  memt::Arena::Guard::~Guard(&local_40);
  memt::Arena::Guard::~Guard(&local_58);
  memt::Arena::~Arena(&local_b0);
  return;
}

Assistant:

TEST(Arena, Guard) {
  memt::Arena arena;
  {
	memt::Arena::Guard noop(arena); // no-op guard
  }

  {
	// double no-op guard
	memt::Arena::Guard guard1(arena);
	memt::Arena::Guard guard2(arena);
  }


  // guard for empty arena with no allocations on it ever
  memt::Arena::Guard emptyGuard(arena);
  arena.freeTop(arena.alloc(10000));
  // guard for empty arena which has allocated some memory previously
  memt::Arena::Guard emptyGuard2(arena);
  // memory use is exponential in number of iterations so do not
  // increase too much.
  void* fromIteration3 = 0;
  for (size_t i = 0; i < 6u; ++i) {
	if (i == 3)
	  fromIteration3 = arena.alloc(1);
	{
	  memt::Arena::Guard noop(arena); // no-op guard
	}
	void* tmp;
	{
	  memt::Arena::Guard g1(arena);
	  {
		memt::Arena::Guard g2(arena);
		tmp = arena.alloc(1);
  	    ASSERT_TRUE(arena.fromArena(tmp));
		g2.release();
	  }
      ASSERT_TRUE(arena.fromArena(tmp)); // released guard did not free
	  memt::Arena::Guard g3(arena);
	  memt::Arena::Guard g4(arena);
	  memt::Arena::Guard g5(arena);
	  memt::Arena::Guard g6(arena);
	  g6.release();
	  g3.release();
	  ASSERT_TRUE(arena.fromArena(tmp));
	}
	ASSERT_FALSE(arena.fromArena(tmp)); // freed despite some guards freed
	// allocate enough memory to force a new block of backing memory
	// inside the arena.
	arena.alloc(arena.getMemoryUse());
  }
  // free a middle allocation to force some blocks to go away
  ASSERT_TRUE(fromIteration3 != 0);
  ASSERT_TRUE(arena.fromArena(fromIteration3));
  arena.freeAndAllAfter(fromIteration3);
}